

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

StringTree * __thiscall
kj::StringTree::
concat<kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree>
          (StringTree *__return_storage_ptr__,StringTree *this,ArrayPtr<const_char> *params,
          StringTree *params_1,StringTree *params_2,ArrayPtr<const_char> *params_3,
          ArrayPtr<const_char> *params_4,ArrayPtr<const_char> *params_5,
          ArrayPtr<const_char> *params_6,ArrayPtr<const_char> *params_7,StringTree *params_8,
          ArrayPtr<const_char> *params_9,ArrayPtr<const_char> *params_10,
          ArrayPtr<const_char> *params_11,StringTree *params_12,ArrayPtr<const_char> *params_13,
          ArrayPtr<const_char> *params_14,ArrayPtr<const_char> *params_15,StringTree *params_16,
          ArrayPtr<const_char> *params_17,ArrayPtr<const_char> *params_18,
          ArrayPtr<const_char> *params_19,ArrayPtr<const_char> *params_20,
          ArrayPtr<const_char> *params_21,StringTree *params_22)

{
  Branch *pBVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  char *__n;
  Branch *pBVar4;
  size_t sVar5;
  long lVar6;
  size_t result_2;
  char *pos;
  char *local_150 [2];
  size_t sStack_140;
  char *local_138;
  size_t sStack_130;
  size_t local_128;
  size_t sStack_120;
  size_t local_118;
  char *local_110;
  char *local_108;
  size_t sStack_100;
  size_t local_f8;
  char *local_f0;
  char *local_e8;
  size_t sStack_e0;
  size_t local_d8;
  char *local_d0;
  char *local_c8;
  size_t sStack_c0;
  size_t local_b8;
  size_t sStack_b0;
  size_t local_a8;
  char *local_a0;
  String local_98;
  StringTree *local_80;
  StringTree *local_78;
  StringTree *local_70;
  StringTree *local_68;
  ArrayPtr<const_char> *local_60;
  size_t local_58;
  size_t local_50;
  size_t local_48;
  char *local_40;
  char *local_38;
  
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->text).content.size_ = 0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  __return_storage_ptr__->size_ = 0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  local_38 = (this->text).content.ptr;
  local_150[0] = local_38;
  local_150[1] = params->ptr;
  sStack_140 = params_1->size_;
  local_40 = (params_2->text).content.ptr;
  local_138 = local_40;
  local_48 = params_3->size_;
  sStack_130 = local_48;
  local_50 = params_4->size_;
  local_128 = local_50;
  local_58 = params_5->size_;
  sStack_120 = local_58;
  local_118 = params_6->size_;
  local_110 = params_7->ptr;
  local_108 = (params_8->text).content.ptr;
  sStack_100 = params_9->size_;
  local_f8 = params_10->size_;
  local_f0 = params_11->ptr;
  local_e8 = (params_12->text).content.ptr;
  sStack_e0 = params_13->size_;
  local_d8 = params_14->size_;
  local_d0 = params_15->ptr;
  local_c8 = (params_16->text).content.ptr;
  sStack_c0 = params_17->size_;
  local_b8 = params_18->size_;
  sStack_b0 = params_19->size_;
  local_a8 = params_20->size_;
  local_a0 = params_21->ptr;
  sVar5 = 0;
  lVar6 = 0;
  do {
    sVar5 = sVar5 + *(long *)((long)local_150 + lVar6);
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0xb8);
  __return_storage_ptr__->size_ = sVar5;
  local_150[1] = (char *)0x0;
  sStack_140 = 0;
  sVar5 = 0;
  local_110 = (char *)0x0;
  local_f0 = (char *)0x0;
  local_d0 = (char *)0x0;
  local_a0 = (char *)0x0;
  lVar6 = 0;
  do {
    sVar5 = sVar5 + *(long *)((long)local_150 + lVar6);
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0xb8);
  local_80 = this;
  local_78 = (StringTree *)params;
  local_70 = params_1;
  local_68 = params_2;
  local_60 = params_3;
  heapString(&local_98,sVar5);
  (__return_storage_ptr__->text).content.ptr = local_98.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_98.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_98.content.disposer;
  sVar5 = 0;
  local_150[0] = (char *)0x0;
  local_150[1] = (char *)0x1;
  sStack_140 = 1;
  local_138 = (char *)0x0;
  sStack_130 = 0;
  local_128 = 0;
  sStack_120 = 0;
  local_118 = 0;
  local_110 = (char *)0x1;
  local_108 = (char *)0x0;
  sStack_100 = 0;
  local_f8 = 0;
  local_f0 = (char *)0x1;
  local_e8 = (char *)0x0;
  sStack_e0 = 0;
  local_d8 = 0;
  local_d0 = (char *)0x1;
  local_c8 = (char *)0x0;
  sStack_c0 = 0;
  local_b8 = 0;
  sStack_b0 = 0;
  local_a8 = 0;
  local_a0 = (char *)0x1;
  lVar6 = 0;
  do {
    sVar5 = sVar5 + *(long *)((long)local_150 + lVar6);
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0xb8);
  pBVar4 = (Branch *)
           _::HeapArrayDisposer::allocateImpl
                     (0x40,sVar5,sVar5,
                      _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch>::construct,
                      ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  local_98.content.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pBVar1 = (__return_storage_ptr__->branches).ptr;
  local_98.content.ptr = (char *)pBVar4;
  local_98.content.size_ = sVar5;
  if (pBVar1 != (Branch *)0x0) {
    sVar2 = (__return_storage_ptr__->branches).size_;
    (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
    (__return_storage_ptr__->branches).size_ = 0;
    pAVar3 = (__return_storage_ptr__->branches).disposer;
    (**pAVar3->_vptr_ArrayDisposer)
              (pAVar3,pBVar1,0x40,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  (__return_storage_ptr__->branches).ptr = pBVar4;
  (__return_storage_ptr__->branches).size_ = sVar5;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pos = (char *)(__return_storage_ptr__->text).content.size_;
  if (pos != (char *)0x0) {
    pos = (__return_storage_ptr__->text).content.ptr;
  }
  __n = (local_80->text).content.ptr;
  if (__n != (char *)0x0) {
    memcpy(pos,(void *)local_80->size_,(size_t)__n);
    pos = pos + (long)__n;
  }
  fill<kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree>
            (__return_storage_ptr__,pos,0,local_78,local_70,(ArrayPtr<const_char> *)local_68,
             local_60,params_4,params_5,params_6,(StringTree *)params_7,
             (ArrayPtr<const_char> *)params_8,params_9,params_10,(StringTree *)params_11,
             (ArrayPtr<const_char> *)params_12,params_13,params_14,(StringTree *)params_15,
             (ArrayPtr<const_char> *)params_16,params_17,params_18,params_19,params_20,
             (StringTree *)params_21);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}